

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

int32_t __thiscall cppnet::Bitmap::GetMinAfter(Bitmap *this,uint32_t index)

{
  uint uVar1;
  pointer plVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int32_t iVar9;
  float fVar10;
  
  plVar2 = (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = this->_vec_bitmap;
  iVar9 = -1;
  if (uVar1 != 0 &&
      (ulong)index <
      (ulong)(((long)(this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)plVar2) * 8)) {
    uVar7 = index >> 6;
    lVar3 = plVar2[uVar7];
    if ((lVar3 == 0) || (uVar6 = lVar3 >> ((byte)index & 0x3f), uVar6 == 0)) {
      bVar4 = (byte)uVar7 & 0x1f;
      uVar5 = uVar1 >> bVar4;
      if (uVar1 >> bVar4 != 0) {
        fVar10 = log2f((float)(int)((-uVar5 & uVar5) + 1));
        iVar8 = (int)(long)fVar10;
        if (iVar8 != 0) {
          plVar2 = (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)(uVar7 + iVar8) <
              (ulong)((long)(this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)plVar2 >> 3)) {
            uVar6 = plVar2[uVar7 + iVar8];
            fVar10 = log2f((float)(long)((-uVar6 & uVar6) + 1));
            iVar9 = (int)(long)fVar10 + iVar8 * 0x40 + (index & 0xffffffc0);
          }
        }
      }
    }
    else {
      fVar10 = log2f((float)(long)(-uVar6 & uVar6));
      iVar9 = (int)(long)fVar10 + index;
    }
  }
  return iVar9;
}

Assistant:

int32_t Bitmap::GetMinAfter(uint32_t index) {
    // get next bit.
    if (index >= _bitmap.size() * __step_size || Empty()) {
        return -1;
    }

    // get index in vector
    uint32_t bitmap_index = index / __step_size;
    // filter smaller bitmap index
    uint32_t ret = bitmap_index * __step_size;

    // find current uint64_t have next 1?
    if (_bitmap[bitmap_index] != 0) {
        int64_t cur_bitmap = _bitmap[bitmap_index];
        int32_t cur_step = index - ret;
        cur_bitmap = cur_bitmap >> cur_step;

        // don't have next 1
        if (cur_bitmap == 0) {
            ret += __step_size;

        // find next 1
        } else {
            ret += cur_step;
            ret += (uint32_t)std::log2f(float(cur_bitmap & (-cur_bitmap)));
            return ret;
        }

    } else {
        ret += __step_size;
    }

    // find next used vector index 
    int32_t temp_vec_bitmap = _vec_bitmap >> bitmap_index;
    if (temp_vec_bitmap == 0) {
        return -1;
    }

    uint32_t next_vec_index = (uint32_t)std::log2f(float((temp_vec_bitmap & (-temp_vec_bitmap)) + 1));
    uint32_t target_vec_index = next_vec_index + bitmap_index;
    if (target_vec_index == bitmap_index) {
        return -1;
    }
    
    if (target_vec_index >= _bitmap.size()) {
        return -1;
    }
    
    int64_t cur_bitmap = _bitmap[target_vec_index];
    ret += (next_vec_index - 1) * __step_size;
    ret += (uint32_t)std::log2f(float((cur_bitmap & (-cur_bitmap)) + 1));

    return ret;
}